

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O0

void tcu::ImageIO::savePNG(ConstPixelBufferAccess *src,char *fileName)

{
  long lVar1;
  png_infop ppVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  TestError *pTVar6;
  __jmp_buf_tag *__env;
  InternalError *this;
  TextureFormat *format;
  void *pvVar7;
  reference ppuVar8;
  int local_88;
  allocator<unsigned_char_*> local_81;
  int y;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rowPointers;
  int pngFormat;
  long local_40;
  png_infop infoPtr;
  png_structp pngPtr;
  FILE *local_20;
  FILE *fp;
  char *fileName_local;
  ConstPixelBufferAccess *src_local;
  
  fp = (FILE *)fileName;
  fileName_local = (char *)src;
  local_20 = fopen(fileName,"wb");
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (local_20 == (FILE *)0x0)) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      TestError::TestError
                (pTVar6,(char *)0x0,"fp",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                 ,0x9e);
      __cxa_throw(pTVar6,&TestError::typeinfo,TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  infoPtr = (png_infop)png_create_write_struct("1.6.37",0,0);
  if (infoPtr == (png_infop)0x0) {
    fclose(local_20);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (infoPtr == (png_infop)0x0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        TestError::TestError
                  (pTVar6,(char *)0x0,"pngPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                   ,0xa5);
        __cxa_throw(pTVar6,&TestError::typeinfo,TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  local_40 = png_create_info_struct(infoPtr);
  if (local_40 == 0) {
    png_destroy_write_struct(&infoPtr,0);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (local_40 == 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        TestError::TestError
                  (pTVar6,(char *)0x0,"infoPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                   ,0xac);
        __cxa_throw(pTVar6,&TestError::typeinfo,TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(infoPtr,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 == 0) {
    format = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)fileName_local);
    rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = textureFormatToPNGFormat(format);
    png_init_io(infoPtr,local_20);
    ppVar2 = infoPtr;
    lVar1 = local_40;
    iVar4 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)fileName_local);
    iVar5 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)fileName_local);
    png_set_IHDR(ppVar2,lVar1,iVar4,iVar5,8,
                 (int)rowPointers.
                      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,0,0);
    png_write_info(infoPtr,local_40);
    iVar4 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)fileName_local);
    std::allocator<unsigned_char_*>::allocator(&local_81);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&y,(long)iVar4,&local_81
              );
    std::allocator<unsigned_char_*>::~allocator(&local_81);
    for (local_88 = 0;
        iVar4 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)fileName_local),
        ppVar2 = infoPtr, local_88 < iVar4; local_88 = local_88 + 1) {
      pvVar7 = ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)fileName_local);
      iVar4 = ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)fileName_local);
      ppuVar8 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&y,
                           (long)local_88);
      *ppuVar8 = (value_type)((long)pvVar7 + (long)(local_88 * iVar4));
    }
    ppuVar8 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&y,0);
    png_write_image(ppVar2,ppuVar8);
    png_write_end(infoPtr,0);
    png_destroy_write_struct(&infoPtr,&local_40);
    fclose(local_20);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&y);
    return;
  }
  png_destroy_write_struct(&infoPtr,&local_40);
  fclose(local_20);
  rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  this = (InternalError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pngFormat,"PNG compression failed",
             (allocator<char> *)
             ((long)&rowPointers.
                     super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  InternalError::InternalError(this,(string *)&pngFormat);
  rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

void savePNG (const ConstPixelBufferAccess& src, const char* fileName)
{
	FILE*	fp			= fopen(fileName, "wb");
	TCU_CHECK(fp);

	png_structp pngPtr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);

	if (!pngPtr)
	{
		fclose(fp);
		TCU_CHECK(pngPtr);
	}

	png_infop infoPtr = png_create_info_struct(pngPtr);
	if (!infoPtr)
	{
		png_destroy_write_struct(&pngPtr, NULL);
		TCU_CHECK(infoPtr);
	}

	if (setjmp(png_jmpbuf(pngPtr)))
	{
		png_destroy_write_struct(&pngPtr, &infoPtr);
		fclose(fp);
		throw tcu::InternalError("PNG compression failed");
	}
	else
	{
		int pngFormat = textureFormatToPNGFormat(src.getFormat());

		png_init_io(pngPtr, fp);

		// Header
		png_set_IHDR(pngPtr, infoPtr, src.getWidth(), src.getHeight(), 8,
					 pngFormat, PNG_INTERLACE_NONE,
					 PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
		png_write_info(pngPtr, infoPtr);

		std::vector<png_bytep> rowPointers(src.getHeight());
		for (int y = 0; y < src.getHeight(); y++)
			rowPointers[y] = (deUint8*)src.getDataPtr() + y*src.getRowPitch();

		png_write_image(pngPtr, &rowPointers[0]);
		png_write_end(pngPtr, NULL);

		png_destroy_write_struct(&pngPtr, &infoPtr);
		fclose(fp);
	}
}